

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

bool __thiscall
Chainstate::DisconnectTip
          (Chainstate *this,BlockValidationState *state,
          DisconnectedBlockTransactions *disconnectpool)

{
  uchar *puVar1;
  long lVar2;
  pointer ppCVar3;
  uint256 *puVar4;
  _Hash_node_base *p_Var5;
  ValidationSignals *this_00;
  uchar *puVar6;
  uchar *puVar7;
  undefined1 *puVar8;
  element_type *block;
  CCoinsView *pCVar9;
  bool bVar10;
  DisconnectResult DVar11;
  long lVar12;
  CCoinsViewCache *baseIn;
  Logger *pLVar13;
  long lVar14;
  CBlockIndex *index;
  shared_ptr<const_CTransaction> *evicted_tx;
  CCoinsView CVar15;
  long in_FS_OFFSET;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  shared_ptr<CBlock> pblock;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  string local_220;
  CCoinsViewCache view;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  ppCVar3 = (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar3 ==
      (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    index = (CBlockIndex *)0x0;
  }
  else {
    index = ppCVar3[-1];
  }
  if (index == (CBlockIndex *)0x0) {
    __assert_fail("pindexDelete",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0xbd0,
                  "bool Chainstate::DisconnectTip(BlockValidationState &, DisconnectedBlockTransactions *)"
                 );
  }
  if (index->pprev == (CBlockIndex *)0x0) {
    __assert_fail("pindexDelete->pprev",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0xbd1,
                  "bool Chainstate::DisconnectTip(BlockValidationState &, DisconnectedBlockTransactions *)"
                 );
  }
  pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<CBlock,std::allocator<CBlock>>
            (&pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (CBlock **)&pblock,(allocator<CBlock> *)&view);
  block = pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  bVar10 = ::node::BlockManager::ReadBlockFromDisk
                     (this->m_blockman,
                      pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,index);
  if (bVar10) {
    lVar12 = std::chrono::_V2::steady_clock::now();
    baseIn = CoinsTip(this);
    CCoinsViewCache::CCoinsViewCache(&view,(CCoinsView *)baseIn,false);
    CCoinsViewCache::GetBestBlock((uint256 *)&local_220,&view);
    puVar4 = index->phashBlock;
    if (puVar4 == (uint256 *)0x0) {
LAB_003fc8d7:
      __assert_fail("phashBlock != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                    ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
    }
    local_248 = *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
    puVar6 = (puVar4->super_base_blob<256U>).m_data._M_elems + 8;
    uStack_240 = *(undefined8 *)puVar6;
    puVar1 = (puVar4->super_base_blob<256U>).m_data._M_elems + 0x10;
    local_238 = *(undefined8 *)puVar1;
    puVar7 = (puVar4->super_base_blob<256U>).m_data._M_elems + 0x18;
    uStack_230 = *(undefined8 *)puVar7;
    auVar17[0] = -(local_220.field_2._M_local_buf[0] == *puVar1);
    auVar17[1] = -(local_220.field_2._M_local_buf[1] ==
                  (puVar4->super_base_blob<256U>).m_data._M_elems[0x11]);
    auVar17[2] = -(local_220.field_2._M_local_buf[2] ==
                  (puVar4->super_base_blob<256U>).m_data._M_elems[0x12]);
    auVar17[3] = -(local_220.field_2._M_local_buf[3] ==
                  (puVar4->super_base_blob<256U>).m_data._M_elems[0x13]);
    auVar17[4] = -(local_220.field_2._M_local_buf[4] ==
                  (puVar4->super_base_blob<256U>).m_data._M_elems[0x14]);
    auVar17[5] = -(local_220.field_2._M_local_buf[5] ==
                  (puVar4->super_base_blob<256U>).m_data._M_elems[0x15]);
    auVar17[6] = -(local_220.field_2._M_local_buf[6] ==
                  (puVar4->super_base_blob<256U>).m_data._M_elems[0x16]);
    auVar17[7] = -(local_220.field_2._M_local_buf[7] ==
                  (puVar4->super_base_blob<256U>).m_data._M_elems[0x17]);
    auVar17[8] = -(local_220.field_2._M_local_buf[8] == *puVar7);
    auVar17[9] = -(local_220.field_2._M_local_buf[9] ==
                  (puVar4->super_base_blob<256U>).m_data._M_elems[0x19]);
    auVar17[10] = -(local_220.field_2._M_local_buf[10] ==
                   (puVar4->super_base_blob<256U>).m_data._M_elems[0x1a]);
    auVar17[0xb] = -(local_220.field_2._M_local_buf[0xb] ==
                    (puVar4->super_base_blob<256U>).m_data._M_elems[0x1b]);
    auVar17[0xc] = -(local_220.field_2._M_local_buf[0xc] ==
                    (puVar4->super_base_blob<256U>).m_data._M_elems[0x1c]);
    auVar17[0xd] = -(local_220.field_2._M_local_buf[0xd] ==
                    (puVar4->super_base_blob<256U>).m_data._M_elems[0x1d]);
    auVar17[0xe] = -(local_220.field_2._M_local_buf[0xe] ==
                    (puVar4->super_base_blob<256U>).m_data._M_elems[0x1e]);
    auVar17[0xf] = -(local_220.field_2._M_local_buf[0xf] ==
                    (puVar4->super_base_blob<256U>).m_data._M_elems[0x1f]);
    auVar16[0] = -((uchar)local_220._M_dataplus._M_p ==
                  (puVar4->super_base_blob<256U>).m_data._M_elems[0]);
    auVar16[1] = -(local_220._M_dataplus._M_p._1_1_ ==
                  (puVar4->super_base_blob<256U>).m_data._M_elems[1]);
    auVar16[2] = -(local_220._M_dataplus._M_p._2_1_ ==
                  (puVar4->super_base_blob<256U>).m_data._M_elems[2]);
    auVar16[3] = -(local_220._M_dataplus._M_p._3_1_ ==
                  (puVar4->super_base_blob<256U>).m_data._M_elems[3]);
    auVar16[4] = -(local_220._M_dataplus._M_p._4_1_ ==
                  (puVar4->super_base_blob<256U>).m_data._M_elems[4]);
    auVar16[5] = -(local_220._M_dataplus._M_p._5_1_ ==
                  (puVar4->super_base_blob<256U>).m_data._M_elems[5]);
    auVar16[6] = -(local_220._M_dataplus._M_p._6_1_ ==
                  (puVar4->super_base_blob<256U>).m_data._M_elems[6]);
    auVar16[7] = -(local_220._M_dataplus._M_p._7_1_ ==
                  (puVar4->super_base_blob<256U>).m_data._M_elems[7]);
    auVar16[8] = -((uchar)local_220._M_string_length == *puVar6);
    auVar16[9] = -(local_220._M_string_length._1_1_ ==
                  (puVar4->super_base_blob<256U>).m_data._M_elems[9]);
    auVar16[10] = -(local_220._M_string_length._2_1_ ==
                   (puVar4->super_base_blob<256U>).m_data._M_elems[10]);
    auVar16[0xb] = -(local_220._M_string_length._3_1_ ==
                    (puVar4->super_base_blob<256U>).m_data._M_elems[0xb]);
    auVar16[0xc] = -(local_220._M_string_length._4_1_ ==
                    (puVar4->super_base_blob<256U>).m_data._M_elems[0xc]);
    auVar16[0xd] = -(local_220._M_string_length._5_1_ ==
                    (puVar4->super_base_blob<256U>).m_data._M_elems[0xd]);
    auVar16[0xe] = -(local_220._M_string_length._6_1_ ==
                    (puVar4->super_base_blob<256U>).m_data._M_elems[0xe]);
    auVar16[0xf] = -(local_220._M_string_length._7_1_ ==
                    (puVar4->super_base_blob<256U>).m_data._M_elems[0xf]);
    auVar16 = auVar16 & auVar17;
    if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) != 0xffff) {
      __assert_fail("view.GetBestBlock() == pindexDelete->GetBlockHash()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                    ,0xbdd,
                    "bool Chainstate::DisconnectTip(BlockValidationState &, DisconnectedBlockTransactions *)"
                   );
    }
    DVar11 = DisconnectBlock(this,block,index,&view);
    if (DVar11 == DISCONNECT_OK) {
      bVar10 = CCoinsViewCache::Flush(&view);
      if (!bVar10) {
        __assert_fail("flushed",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0xbe3,
                      "bool Chainstate::DisconnectTip(BlockValidationState &, DisconnectedBlockTransactions *)"
                     );
      }
    }
    else {
      puVar4 = index->phashBlock;
      if (puVar4 == (uint256 *)0x0) goto LAB_003fc8d7;
      local_248 = *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
      uStack_240 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
      local_238 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
      uStack_230 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
      base_blob<256u>::ToString_abi_cxx11_(&local_220,&local_248);
      logging_function._M_str = "DisconnectTip";
      logging_function._M_len = 0xd;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file._M_len = 0x5e;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,0xbdf,ALL,Error,(ConstevalFormatString<1U>)0x821f91,
                 &local_220);
      puVar8 = (undefined1 *)
               CONCAT17(local_220._M_dataplus._M_p._7_1_,
                        CONCAT16(local_220._M_dataplus._M_p._6_1_,
                                 CONCAT15(local_220._M_dataplus._M_p._5_1_,
                                          CONCAT14(local_220._M_dataplus._M_p._4_1_,
                                                   CONCAT13(local_220._M_dataplus._M_p._3_1_,
                                                            CONCAT12(local_220._M_dataplus._M_p.
                                                                     _2_1_,CONCAT11(local_220.
                                                                                    _M_dataplus._M_p
                                                                                    ._1_1_,(uchar)
                                                  local_220._M_dataplus._M_p)))))));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8 != &local_220.field_2) {
        operator_delete(puVar8,CONCAT17(local_220.field_2._M_local_buf[7],
                                        CONCAT16(local_220.field_2._M_local_buf[6],
                                                 CONCAT15(local_220.field_2._M_local_buf[5],
                                                          CONCAT14(local_220.field_2._M_local_buf[4]
                                                                   ,CONCAT13(local_220.field_2.
                                                                             _M_local_buf[3],
                                                                             CONCAT12(local_220.
                                                                                      field_2.
                                                  _M_local_buf[2],
                                                  CONCAT11(local_220.field_2._M_local_buf[1],
                                                           local_220.field_2._M_local_buf[0])))))))
                               + 1);
      }
    }
    view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
         (_func_int **)&PTR_GetCoin_00b19380;
    std::
    _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&view.cacheCoins._M_h);
    if (view.m_sentinel.second.m_flags != '\0') {
      ((view.m_sentinel.second.m_next)->second).m_prev = view.m_sentinel.second.m_prev;
      ((view.m_sentinel.second.m_prev)->second).m_next = view.m_sentinel.second.m_next;
      view.m_sentinel.second.m_flags = '\0';
    }
    if (0x1c < view.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._size) {
      free(view.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
           indirect);
      view.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
      indirect = (char *)0x0;
    }
    PoolResource<144UL,_8UL>::~PoolResource(&view.m_cache_coins_memory_resource);
    if (DVar11 == DISCONNECT_OK) {
      pLVar13 = LogInstance();
      bVar10 = BCLog::Logger::WillLogCategoryLevel(pLVar13,BENCH,Debug);
      if (bVar10) {
        lVar14 = std::chrono::_V2::steady_clock::now();
        view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
             (_func_int **)((double)(lVar14 - lVar12) / 1000000.0);
        logging_function_01._M_str = "DisconnectTip";
        logging_function_01._M_len = 0xd;
        source_file_01._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file_01._M_len = 0x5e;
        LogPrintFormatInternal<double>
                  (logging_function_01,source_file_01,0xbe6,BENCH,Debug,
                   (ConstevalFormatString<1U>)0x821fc5,(double *)&view);
      }
      view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView._0_4_ = index->nHeight + -1;
      for (p_Var5 = (this->m_blockman->m_prune_locks)._M_h._M_before_begin._M_nxt;
          p_Var5 != (_Hash_node_base *)0x0; p_Var5 = p_Var5->_M_nxt) {
        if ((int)view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView <
            *(int *)&p_Var5[5]._M_nxt) {
          *(int *)&p_Var5[5]._M_nxt =
               (int)view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView;
          pLVar13 = LogInstance();
          bVar10 = BCLog::Logger::WillLogCategoryLevel(pLVar13,PRUNE,Debug);
          if (bVar10) {
            logging_function_02._M_str = "DisconnectTip";
            logging_function_02._M_len = 0xd;
            source_file_02._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
            ;
            source_file_02._M_len = 0x5e;
            LogPrintFormatInternal<std::__cxx11::string,int>
                      (logging_function_02,source_file_02,0xbef,PRUNE,Debug,
                       (ConstevalFormatString<2U>)0x821fe1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var5 + 1),(int *)&view);
          }
        }
      }
      bVar10 = FlushStateToDisk(this,state,IF_NEEDED,0);
      if (bVar10) {
        if ((disconnectpool != (DisconnectedBlockTransactions *)0x0) &&
           (this->m_mempool != (CTxMemPool *)0x0)) {
          DisconnectedBlockTransactions::AddTransactionsFromBlock
                    ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)&view,disconnectpool,&block->vtx);
          pCVar9 = view.super_CCoinsViewBacked.base;
          for (CVar15 = view.super_CCoinsViewBacked.super_CCoinsView;
              (CCoinsView *)CVar15._vptr_CCoinsView != pCVar9;
              CVar15._vptr_CCoinsView = CVar15._vptr_CCoinsView + 2) {
            CTxMemPool::removeRecursive
                      (this->m_mempool,
                       (CTransaction *)((CCoinsView *)CVar15._vptr_CCoinsView)->_vptr_CCoinsView,
                       REORG);
          }
          std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     *)&view);
        }
        CChain::SetTip(&this->m_chain,index->pprev);
        UpdateTip(this,index->pprev);
        this_00 = (this->m_chainman->m_options).signals;
        bVar10 = true;
        if (this_00 != (ValidationSignals *)0x0) {
          view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
               (_func_int **)pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          view.super_CCoinsViewBacked.base =
               (CCoinsView *)
               pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if (pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          ValidationSignals::BlockDisconnected(this_00,(shared_ptr<const_CBlock> *)&view,index);
          if (view.super_CCoinsViewBacked.base != (CCoinsView *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       view.super_CCoinsViewBacked.base);
          }
        }
        goto LAB_003fc7b5;
      }
    }
  }
  else {
    logging_function_00._M_str = "DisconnectTip";
    logging_function_00._M_len = 0xd;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file_00._M_len = 0x5e;
    LogPrintFormatInternal<>
              (logging_function_00,source_file_00,0xbd6,ALL,Error,
               (ConstevalFormatString<0U>)0x821f36);
  }
  bVar10 = false;
LAB_003fc7b5:
  if (pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar10;
  }
  __stack_chk_fail();
}

Assistant:

bool Chainstate::DisconnectTip(BlockValidationState& state, DisconnectedBlockTransactions* disconnectpool)
{
    AssertLockHeld(cs_main);
    if (m_mempool) AssertLockHeld(m_mempool->cs);

    CBlockIndex *pindexDelete = m_chain.Tip();
    assert(pindexDelete);
    assert(pindexDelete->pprev);
    // Read block from disk.
    std::shared_ptr<CBlock> pblock = std::make_shared<CBlock>();
    CBlock& block = *pblock;
    if (!m_blockman.ReadBlockFromDisk(block, *pindexDelete)) {
        LogError("DisconnectTip(): Failed to read block\n");
        return false;
    }
    // Apply the block atomically to the chain state.
    const auto time_start{SteadyClock::now()};
    {
        CCoinsViewCache view(&CoinsTip());
        assert(view.GetBestBlock() == pindexDelete->GetBlockHash());
        if (DisconnectBlock(block, pindexDelete, view) != DISCONNECT_OK) {
            LogError("DisconnectTip(): DisconnectBlock %s failed\n", pindexDelete->GetBlockHash().ToString());
            return false;
        }
        bool flushed = view.Flush();
        assert(flushed);
    }
    LogDebug(BCLog::BENCH, "- Disconnect block: %.2fms\n",
             Ticks<MillisecondsDouble>(SteadyClock::now() - time_start));

    {
        // Prune locks that began at or after the tip should be moved backward so they get a chance to reorg
        const int max_height_first{pindexDelete->nHeight - 1};
        for (auto& prune_lock : m_blockman.m_prune_locks) {
            if (prune_lock.second.height_first <= max_height_first) continue;

            prune_lock.second.height_first = max_height_first;
            LogDebug(BCLog::PRUNE, "%s prune lock moved back to %d\n", prune_lock.first, max_height_first);
        }
    }

    // Write the chain state to disk, if necessary.
    if (!FlushStateToDisk(state, FlushStateMode::IF_NEEDED)) {
        return false;
    }

    if (disconnectpool && m_mempool) {
        // Save transactions to re-add to mempool at end of reorg. If any entries are evicted for
        // exceeding memory limits, remove them and their descendants from the mempool.
        for (auto&& evicted_tx : disconnectpool->AddTransactionsFromBlock(block.vtx)) {
            m_mempool->removeRecursive(*evicted_tx, MemPoolRemovalReason::REORG);
        }
    }

    m_chain.SetTip(*pindexDelete->pprev);

    UpdateTip(pindexDelete->pprev);
    // Let wallets know transactions went from 1-confirmed to
    // 0-confirmed or conflicted:
    if (m_chainman.m_options.signals) {
        m_chainman.m_options.signals->BlockDisconnected(pblock, pindexDelete);
    }
    return true;
}